

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OsCompat.cpp
# Opt level: O0

char * __thiscall OsCompat::extname(OsCompat *this,char *str)

{
  char *pcVar1;
  char *in_RSI;
  char *tmpStr;
  char *last;
  char *result;
  char *local_8;
  
  pcVar1 = strrchr(in_RSI,0x2e);
  if (pcVar1 == (char *)0x0) {
    local_8 = "";
  }
  else if ((*pcVar1 == '.') && (pcVar1 == in_RSI)) {
    local_8 = "";
  }
  else {
    local_8 = (char *)malloc(0x100);
    snprintf(local_8,0x100,"%s",pcVar1 + 1);
  }
  return local_8;
}

Assistant:

char * OsCompat::extname(const char *str) {
    char *result;
    char *last;
    char *tmpStr = const_cast<char *>(str);

    if ((last = strrchr(tmpStr, '.')) != nullptr) {
        if ((*last == '.') && (last == tmpStr))
            return "";
        else {
            result = (char*) malloc(_MAX_EXT);
            snprintf(result, _MAX_EXT, "%s", last + 1);
            return result;
        }
    } else {
        return ""; // Empty/nullptr string
    }
}